

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O0

void __thiscall bsplib::Rdma::ActionBuf::ActionBuf(ActionBuf *this,int nprocs)

{
  size_type sVar1;
  allocator<unsigned_long> local_25 [16];
  allocator<unsigned_long> local_15;
  int local_14;
  ActionBuf *pAStack_10;
  int nprocs_local;
  ActionBuf *this_local;
  
  (this->m_actions).super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_actions).super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_actions).super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_14 = nprocs;
  pAStack_10 = this;
  std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::vector(&this->m_actions)
  ;
  sVar1 = (size_type)local_14;
  std::allocator<unsigned_long>::allocator(&local_15);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_counts,sVar1,&local_15);
  std::allocator<unsigned_long>::~allocator(&local_15);
  sVar1 = (size_type)local_14;
  std::allocator<unsigned_long>::allocator(local_25);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_get_buffer_offset,sVar1,local_25);
  std::allocator<unsigned_long>::~allocator(local_25);
  return;
}

Assistant:

ActionBuf( int nprocs )
            : m_actions()
            , m_counts( nprocs )
            , m_get_buffer_offset( nprocs )
        {}